

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.H
# Opt level: O2

void __thiscall amrex::AmrMesh::AmrMesh(AmrMesh *this,AmrMesh *rhs)

{
  pointer pGVar1;
  pointer pDVar2;
  pointer pBVar3;
  uint uVar4;
  
  AmrInfo::AmrInfo(&this->super_AmrInfo,&rhs->super_AmrInfo);
  this->_vptr_AmrMesh = (_func_int **)&PTR__AmrMesh_006daa58;
  *(undefined4 *)&(this->super_AmrInfo).field_0x8c = *(undefined4 *)&(rhs->super_AmrInfo).field_0x8c
  ;
  pGVar1 = (rhs->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_start =
       (rhs->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_finish = pGVar1;
  (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (rhs->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (rhs->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (rhs->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (rhs->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pDVar2 = (rhs->dmap).
           super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
           super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  .super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (rhs->dmap).
       super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
       super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  .super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_finish = pDVar2;
  (this->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  .super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (rhs->dmap).
       super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
       super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (rhs->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (rhs->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (rhs->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pBVar3 = (rhs->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
           super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_start =
       (rhs->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_finish = pBVar3;
  (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (rhs->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (rhs->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (rhs->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (rhs->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar4 = rhs->num_setba;
  this->num_setdm = rhs->num_setdm;
  this->num_setba = uVar4;
  return;
}

Assistant:

AmrMesh (AmrMesh&& rhs) = default;